

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_write_attributes_uint8(void *a,uint8_t *attrib,uint32_t nr_of_attribs)

{
  ssize_t sVar1;
  uint local_4078;
  uint local_4074;
  char *pcStack_4070;
  uint32_t bytes_written;
  uint8_t *compressed_buf;
  LZ4_stream_t **ppLStack_4060;
  uint estimateLen;
  LZ4_stream_t *lz4Stream;
  LZ4_stream_t lz4Stream_body;
  void *pvStack_30;
  uint8_t header;
  trico_archive *arch;
  uint8_t *puStack_20;
  uint32_t nr_of_attribs_local;
  uint8_t *attrib_local;
  void *a_local;
  
  lz4Stream_body.table[0x803]._7_1_ = 0x11;
  pvStack_30 = a;
  arch._4_4_ = nr_of_attribs;
  puStack_20 = attrib;
  attrib_local = (uint8_t *)a;
  sVar1 = write((int)&lz4Stream_body + 0x401f,(void *)0x1,1);
  if ((int)sVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    sVar1 = write((int)&arch + 4,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      ppLStack_4060 = &lz4Stream;
      LZ4_initStream(ppLStack_4060,0x4020);
      if (arch._4_4_ < 0x7e000001) {
        local_4078 = arch._4_4_ + arch._4_4_ / 0xff + 0x10;
      }
      else {
        local_4078 = 0;
      }
      compressed_buf._4_4_ = local_4078;
      pcStack_4070 = (char *)trico_malloc((ulong)local_4078);
      local_4074 = LZ4_compress_default
                             ((char *)puStack_20,pcStack_4070,arch._4_4_,compressed_buf._4_4_);
      sVar1 = write((int)&local_4074,(void *)0x4,1);
      if ((int)sVar1 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        sVar1 = write((int)pcStack_4070,(void *)0x1,(ulong)local_4074);
        if ((int)sVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          trico_free(pcStack_4070);
          a_local._4_4_ = 1;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int trico_write_attributes_uint8(void* a, const uint8_t* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_uint8_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0; 

  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)attrib, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  return 1;
  }